

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

float Imath_3_2::anon_unknown_20::maxOffDiag<float>(Matrix44<float> *A)

{
  float *pfVar1;
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar2;
  int j;
  int i;
  float result;
  float local_18;
  int local_14;
  int local_10;
  float local_c;
  Matrix44<float> *local_8;
  
  local_c = 0.0;
  local_8 = in_RDI;
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      if (local_10 != local_14) {
        pMVar2 = local_8;
        Matrix44<float>::operator[](local_8,local_10);
        std::abs((int)pMVar2);
        pfVar1 = std::max<float>(&local_c,&local_18);
        local_c = *pfVar1;
      }
    }
  }
  return local_c;
}

Assistant:

IMATH_CONSTEXPR14 T
maxOffDiag (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T result = 0;
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i != j) result = std::max (result, std::abs (A[i][j]));
        }
    }

    return result;
}